

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall kj::Promise<bool>::wait(Promise<bool> *this,void *__stat_loc)

{
  SourceLocation location;
  bool bVar1;
  undefined7 extraout_var;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ExceptionOr<bool> result;
  ExceptionOr<bool> local_1a8;
  
  local_1a8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1a8.value.ptr.isSet = false;
  location.function = (char *)in_stack_00000010;
  location.fileName = (char *)in_stack_00000008;
  location._16_8_ = in_stack_00000018;
  kj::_::waitImpl((OwnPromiseNode *)this,&local_1a8.super_ExceptionOrValue,(WaitScope *)__stat_loc,
                  location);
  bVar1 = kj::_::convertToReturn<bool>(&local_1a8);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1a8);
  return (__pid_t)CONCAT71(extraout_var,bVar1);
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}